

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

string * __thiscall rlib::JsonT<void>::stringify_abi_cxx11_(JsonT<void> *this)

{
  Format *in_RDI;
  Format *in_stack_00000120;
  JsonT<void> *in_stack_00000128;
  Format *in_stack_ffffffffffffff90;
  
  Stringify::Format::Format(in_stack_ffffffffffffff90);
  stringify_abi_cxx11_(in_stack_00000128,in_stack_00000120);
  Stringify::Format::~Format(in_RDI);
  return &in_RDI->lf;
}

Assistant:

std::string stringify() const {
			return stringify(typename Stringify::Format());
		}